

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.h
# Opt level: O1

uint __thiscall Potassco::ProgramReader::matchPos(ProgramReader *this,uint max,char *err)

{
  bool bVar1;
  uint line;
  BufferedStream *this_00;
  int64_t x;
  uint local_20;
  int iStack_1c;
  
  this_00 = stream(this);
  bVar1 = BufferedStream::match(this_00,(int64_t *)&local_20,false);
  if (((!bVar1) || (iStack_1c < 0)) || ((ulong)max < CONCAT44(iStack_1c,local_20))) {
    line = BufferedStream::line(this_00);
    BufferedStream::fail(line,err);
  }
  return local_20;
}

Assistant:

unsigned matchPos(unsigned max = static_cast<unsigned>(-1), const char* err = "unsigned integer expected") { return Potassco::matchPos(*stream(), max, err); }